

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_common.c
# Opt level: O0

AV1LrMTInfo * get_lr_job_info(AV1LrSync *lr_sync)

{
  long in_RDI;
  AV1LrMTInfo *cur_job_info;
  undefined8 local_10;
  
  local_10 = (AV1LrMTInfo *)0x0;
  pthread_mutex_lock(*(pthread_mutex_t **)(in_RDI + 0x58));
  if (((*(byte *)(in_RDI + 0x78) & 1) == 0) && (*(int *)(in_RDI + 0x74) < *(int *)(in_RDI + 0x70)))
  {
    local_10 = (AV1LrMTInfo *)(*(long *)(in_RDI + 0x68) + (long)*(int *)(in_RDI + 0x74) * 0x1c);
    *(int *)(in_RDI + 0x74) = *(int *)(in_RDI + 0x74) + 1;
  }
  pthread_mutex_unlock(*(pthread_mutex_t **)(in_RDI + 0x58));
  return local_10;
}

Assistant:

static AV1LrMTInfo *get_lr_job_info(AV1LrSync *lr_sync) {
  AV1LrMTInfo *cur_job_info = NULL;

#if CONFIG_MULTITHREAD
  pthread_mutex_lock(lr_sync->job_mutex);

  if (!lr_sync->lr_mt_exit && lr_sync->jobs_dequeued < lr_sync->jobs_enqueued) {
    cur_job_info = lr_sync->job_queue + lr_sync->jobs_dequeued;
    lr_sync->jobs_dequeued++;
  }

  pthread_mutex_unlock(lr_sync->job_mutex);
#else
  (void)lr_sync;
#endif

  return cur_job_info;
}